

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrref.h
# Opt level: O3

void __thiscall StringRef::append(StringRef *this,char *s,long l)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = this->len;
  uVar1 = lVar4 + l;
  if (this->alo < (long)uVar1) {
    uVar3 = 0x100;
    if (0x200 < (long)uVar1) {
      uVar3 = uVar1 >> 1;
    }
    this->alo = uVar3 + uVar1;
    pcVar2 = (char *)realloc(this->str,uVar3 + uVar1 + 1);
    this->str = pcVar2;
    lVar4 = this->len;
  }
  else {
    pcVar2 = this->str;
  }
  memcpy(pcVar2 + lVar4,s,l);
  this->str[l + this->len] = '\0';
  this->len = this->len + l;
  return;
}

Assistant:

void append(const char *s, long l)
    {
        /* if necessary, reallocate the buffer */
        if (len + l > alo)
        {
            /* 
             *   calculate the expansion size: go to the needed length plus
             *   half again that total for headroom, with minimum headroom of
             *   256 bytes 
             */
            alo = len + l + (len+l > 512 ? (len+l)/2 : 256);

            /* allocate the new buffer */
            str = (char *)t3realloc(str, alo + 1);
        }

        /* copy the new text */
        memcpy(str + len, s, l);

        /* null-terminate it */
        str[len + l] = '\0';

        /* note the new length */
        len += l;
    }